

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O2

FT_Error tt_face_colr_blend_layer
                   (TT_Face face,FT_UInt color_index,FT_GlyphSlot dstSlot,FT_GlyphSlot srcSlot)

{
  FT_UInt *pFVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  FT_Color *pFVar7;
  FT_UShort *pFVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  FT_Int FVar13;
  byte bVar14;
  uint uVar15;
  FT_Byte *buffer;
  byte bVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  FT_Byte *__dest;
  byte bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  uchar *puVar26;
  int iVar27;
  ulong uVar28;
  uchar *local_60;
  FT_Error error;
  FT_GlyphSlot local_38;
  
  local_38 = srcSlot;
  if ((dstSlot->bitmap).buffer == (uchar *)0x0) {
    FVar13 = srcSlot->bitmap_top;
    dstSlot->bitmap_left = srcSlot->bitmap_left;
    dstSlot->bitmap_top = FVar13;
    uVar15 = (srcSlot->bitmap).width;
    (dstSlot->bitmap).width = uVar15;
    uVar24 = (srcSlot->bitmap).rows;
    (dstSlot->bitmap).rows = uVar24;
    (dstSlot->bitmap).pixel_mode = '\a';
    iVar25 = uVar15 * 4;
    (dstSlot->bitmap).pitch = iVar25;
    (dstSlot->bitmap).num_grays = 0x100;
    uVar17 = (ulong)(iVar25 * uVar24);
    error = ft_glyphslot_alloc_bitmap(dstSlot,uVar17);
    if (error != 0) {
      return error;
    }
    memset((dstSlot->bitmap).buffer,0,uVar17);
  }
  else {
    iVar25 = dstSlot->bitmap_left;
    iVar19 = dstSlot->bitmap_top;
    iVar22 = (dstSlot->bitmap).width + iVar25;
    iVar5 = srcSlot->bitmap_left;
    iVar6 = srcSlot->bitmap_top;
    iVar23 = iVar19 - (dstSlot->bitmap).rows;
    iVar27 = (srcSlot->bitmap).width + iVar5;
    iVar21 = iVar6 - (srcSlot->bitmap).rows;
    iVar9 = iVar21;
    if (iVar23 < iVar21) {
      iVar9 = iVar23;
    }
    iVar10 = iVar6;
    if (iVar6 < iVar19) {
      iVar10 = iVar19;
    }
    iVar11 = iVar5;
    if (iVar25 < iVar5) {
      iVar11 = iVar25;
    }
    iVar12 = iVar27;
    if (iVar27 < iVar22) {
      iVar12 = iVar22;
    }
    if ((iVar22 < iVar27 || iVar5 < iVar25) || (iVar19 < iVar6 || iVar21 < iVar23)) {
      uVar15 = (iVar12 - iVar11) * 4;
      buffer = (FT_Byte *)
               ft_mem_alloc((face->root).memory,(ulong)((iVar10 - iVar9) * uVar15),&error);
      if (error != 0) {
        return error;
      }
      puVar26 = (dstSlot->bitmap).buffer;
      __dest = buffer + ((long)dstSlot->bitmap_left - (long)iVar11) * 4 +
                        (long)(int)((iVar10 - dstSlot->bitmap_top) * uVar15);
      for (uVar24 = 0; uVar24 < (dstSlot->bitmap).rows; uVar24 = uVar24 + 1) {
        memcpy(__dest,puVar26,(ulong)((dstSlot->bitmap).width << 2));
        puVar26 = puVar26 + (dstSlot->bitmap).pitch;
        __dest = __dest + uVar15;
      }
      ft_glyphslot_set_bitmap(dstSlot,buffer);
      dstSlot->bitmap_top = iVar10;
      dstSlot->bitmap_left = iVar11;
      (dstSlot->bitmap).width = iVar12 - iVar11;
      (dstSlot->bitmap).rows = iVar10 - iVar9;
      (dstSlot->bitmap).pitch = uVar15;
      pFVar1 = &dstSlot->internal->flags;
      *pFVar1 = *pFVar1 | 1;
      dstSlot->format = FT_GLYPH_FORMAT_BITMAP;
      srcSlot = local_38;
    }
  }
  if (color_index == 0xffff) {
    if (face->have_foreground_color == '\0') {
      pFVar8 = (face->palette_data).palette_flags;
      if (pFVar8 != (FT_UShort *)0x0) {
        bVar16 = 0xff;
        bVar14 = 0xff;
        bVar18 = 0xff;
        bVar20 = 0xff;
        if ((pFVar8[face->palette_index] & 2) != 0) goto LAB_00209e0b;
      }
      bVar16 = 0xff;
      bVar14 = 0;
      bVar18 = 0;
      bVar20 = 0;
    }
    else {
      bVar20 = (face->foreground_color).blue;
      bVar18 = (face->foreground_color).green;
      bVar14 = (face->foreground_color).red;
      bVar16 = (face->foreground_color).alpha;
    }
  }
  else {
    pFVar7 = face->palette;
    bVar20 = pFVar7[color_index].blue;
    bVar18 = pFVar7[color_index].green;
    bVar14 = pFVar7[color_index].red;
    bVar16 = pFVar7[color_index].alpha;
  }
LAB_00209e0b:
  local_60 = (srcSlot->bitmap).buffer;
  puVar26 = (dstSlot->bitmap).buffer +
            ((long)srcSlot->bitmap_left - (long)dstSlot->bitmap_left) * 4 +
            ((long)dstSlot->bitmap_top - (long)srcSlot->bitmap_top) * (long)(dstSlot->bitmap).pitch;
  for (uVar15 = 0; uVar15 < (srcSlot->bitmap).rows; uVar15 = uVar15 + 1) {
    uVar17 = 3;
    for (uVar28 = 0; uVar28 < (srcSlot->bitmap).width; uVar28 = uVar28 + 1) {
      uVar24 = ((uint)local_60[uVar28] * (uint)bVar16) / 0xff;
      iVar19 = 0xff - uVar24;
      iVar25 = (int)uVar17;
      bVar2 = puVar26[iVar25 - 2U];
      bVar3 = puVar26[iVar25 - 1U];
      bVar4 = puVar26[uVar17];
      puVar26[iVar25 - 3U] =
           (char)(((uint)puVar26[iVar25 - 3U] * iVar19 & 0xffff) / 0xff) +
           (char)((uVar24 * bVar20 & 0xffff) / 0xff);
      puVar26[iVar25 - 2U] =
           (char)(((uint)bVar2 * iVar19 & 0xffff) / 0xff) +
           (char)((uVar24 * bVar18 & 0xffff) / 0xff);
      puVar26[iVar25 - 1U] =
           (char)(((uint)bVar3 * iVar19 & 0xffff) / 0xff) +
           (char)((uVar24 * bVar14 & 0xffff) / 0xff);
      puVar26[uVar17] = (char)(((uint)bVar4 * iVar19 & 0xffff) / 0xff) + (char)uVar24;
      uVar17 = (ulong)(iVar25 + 4);
      srcSlot = local_38;
    }
    local_60 = local_60 + (srcSlot->bitmap).pitch;
    puVar26 = puVar26 + (dstSlot->bitmap).pitch;
  }
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_colr_blend_layer( TT_Face       face,
                            FT_UInt       color_index,
                            FT_GlyphSlot  dstSlot,
                            FT_GlyphSlot  srcSlot )
  {
    FT_Error  error;

    FT_UInt  x, y;
    FT_Byte  b, g, r, alpha;

    FT_ULong  size;
    FT_Byte*  src;
    FT_Byte*  dst;


    if ( !dstSlot->bitmap.buffer )
    {
      /* Initialize destination of color bitmap */
      /* with the size of first component.      */
      dstSlot->bitmap_left = srcSlot->bitmap_left;
      dstSlot->bitmap_top  = srcSlot->bitmap_top;

      dstSlot->bitmap.width      = srcSlot->bitmap.width;
      dstSlot->bitmap.rows       = srcSlot->bitmap.rows;
      dstSlot->bitmap.pixel_mode = FT_PIXEL_MODE_BGRA;
      dstSlot->bitmap.pitch      = (int)dstSlot->bitmap.width * 4;
      dstSlot->bitmap.num_grays  = 256;

      size = dstSlot->bitmap.rows * (unsigned int)dstSlot->bitmap.pitch;

      error = ft_glyphslot_alloc_bitmap( dstSlot, size );
      if ( error )
        return error;

      FT_MEM_ZERO( dstSlot->bitmap.buffer, size );
    }
    else
    {
      /* Resize destination if needed such that new component fits. */
      FT_Int  x_min, x_max, y_min, y_max;


      x_min = FT_MIN( dstSlot->bitmap_left, srcSlot->bitmap_left );
      x_max = FT_MAX( dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width,
                      srcSlot->bitmap_left + (FT_Int)srcSlot->bitmap.width );

      y_min = FT_MIN( dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows,
                      srcSlot->bitmap_top - (FT_Int)srcSlot->bitmap.rows );
      y_max = FT_MAX( dstSlot->bitmap_top, srcSlot->bitmap_top );

      if ( x_min != dstSlot->bitmap_left                                 ||
           x_max != dstSlot->bitmap_left + (FT_Int)dstSlot->bitmap.width ||
           y_min != dstSlot->bitmap_top - (FT_Int)dstSlot->bitmap.rows   ||
           y_max != dstSlot->bitmap_top                                  )
      {
        FT_Memory  memory = face->root.memory;

        FT_UInt  width = (FT_UInt)( x_max - x_min );
        FT_UInt  rows  = (FT_UInt)( y_max - y_min );
        FT_UInt  pitch = width * 4;

        FT_Byte*  buf = NULL;
        FT_Byte*  p;
        FT_Byte*  q;


        size  = rows * pitch;
        if ( FT_ALLOC( buf, size ) )
          return error;

        p = dstSlot->bitmap.buffer;
        q = buf +
            (int)pitch * ( y_max - dstSlot->bitmap_top ) +
            4 * ( dstSlot->bitmap_left - x_min );

        for ( y = 0; y < dstSlot->bitmap.rows; y++ )
        {
          FT_MEM_COPY( q, p, dstSlot->bitmap.width * 4 );

          p += dstSlot->bitmap.pitch;
          q += pitch;
        }

        ft_glyphslot_set_bitmap( dstSlot, buf );

        dstSlot->bitmap_top  = y_max;
        dstSlot->bitmap_left = x_min;

        dstSlot->bitmap.width = width;
        dstSlot->bitmap.rows  = rows;
        dstSlot->bitmap.pitch = (int)pitch;

        dstSlot->internal->flags |= FT_GLYPH_OWN_BITMAP;
        dstSlot->format           = FT_GLYPH_FORMAT_BITMAP;
      }
    }

    if ( color_index == 0xFFFF )
    {
      if ( face->have_foreground_color )
      {
        b     = face->foreground_color.blue;
        g     = face->foreground_color.green;
        r     = face->foreground_color.red;
        alpha = face->foreground_color.alpha;
      }
      else
      {
        if ( face->palette_data.palette_flags                          &&
             ( face->palette_data.palette_flags[face->palette_index] &
                 FT_PALETTE_FOR_DARK_BACKGROUND                      ) )
        {
          /* white opaque */
          b     = 0xFF;
          g     = 0xFF;
          r     = 0xFF;
          alpha = 0xFF;
        }
        else
        {
          /* black opaque */
          b     = 0x00;
          g     = 0x00;
          r     = 0x00;
          alpha = 0xFF;
        }
      }
    }
    else
    {
      b     = face->palette[color_index].blue;
      g     = face->palette[color_index].green;
      r     = face->palette[color_index].red;
      alpha = face->palette[color_index].alpha;
    }

    /* XXX Convert if srcSlot.bitmap is not grey? */
    src = srcSlot->bitmap.buffer;
    dst = dstSlot->bitmap.buffer +
          dstSlot->bitmap.pitch * ( dstSlot->bitmap_top - srcSlot->bitmap_top ) +
          4 * ( srcSlot->bitmap_left - dstSlot->bitmap_left );

    for ( y = 0; y < srcSlot->bitmap.rows; y++ )
    {
      for ( x = 0; x < srcSlot->bitmap.width; x++ )
      {
        int  aa = src[x];
        int  fa = alpha * aa / 255;

        int  fb = b * fa / 255;
        int  fg = g * fa / 255;
        int  fr = r * fa / 255;

        int  ba2 = 255 - fa;

        int  bb = dst[4 * x + 0];
        int  bg = dst[4 * x + 1];
        int  br = dst[4 * x + 2];
        int  ba = dst[4 * x + 3];


        dst[4 * x + 0] = (FT_Byte)( bb * ba2 / 255 + fb );
        dst[4 * x + 1] = (FT_Byte)( bg * ba2 / 255 + fg );
        dst[4 * x + 2] = (FT_Byte)( br * ba2 / 255 + fr );
        dst[4 * x + 3] = (FT_Byte)( ba * ba2 / 255 + fa );
      }

      src += srcSlot->bitmap.pitch;
      dst += dstSlot->bitmap.pitch;
    }

    return FT_Err_Ok;
  }